

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O2

void ghod_hitsu(monst *priest)

{
  char bx;
  char by;
  char cVar1;
  level *plVar2;
  char cVar3;
  boolean bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int dy;
  char *pcVar8;
  char *line;
  char cVar9;
  char cVar10;
  char cVar11;
  
  cVar3 = temple_occupied(u.urooms);
  if ((cVar3 == '\0') || (bVar4 = has_shrine(priest), plVar2 = level, bVar4 == '\0')) {
    return;
  }
  bx = priest->field_0x76;
  by = priest->field_0x77;
  cVar9 = bx;
  cVar5 = by;
  if ((u.uy == by && u.ux == bx) ||
     (bVar4 = linedup(u.ux,u.uy,bx,by), cVar9 = u.ux, cVar5 = u.uy, cVar11 = bx, cVar10 = by,
     bVar4 == '\0')) {
    pcVar8 = (char *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x3358);
    if (level->locations[cVar9][cVar5].typ == '\x17') {
      cVar1 = *pcVar8;
      cVar11 = *(char *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x3359);
      cVar10 = cVar5;
      if ((cVar1 + -1 != (int)cVar9) &&
         (iVar7 = (int)cVar11, cVar11 = cVar1, iVar7 + 1 != (int)cVar9)) {
        cVar1 = *(char *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x335a);
        cVar3 = *(char *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x335b);
        cVar11 = cVar9;
        cVar10 = cVar3;
        if ((cVar1 + -1 != (int)cVar5) && (cVar11 = bx, cVar10 = by, cVar3 + 1 == (int)cVar5)) {
          cVar11 = cVar9;
          cVar10 = cVar1;
        }
      }
    }
    else {
      uVar6 = mt_random();
      cVar11 = u.ux;
      cVar10 = u.uy;
      switch(uVar6 & 3) {
      case 0:
        cVar10 = *(xchar *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x335a);
        break;
      case 1:
        cVar10 = *(xchar *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x335b);
        break;
      case 2:
        cVar11 = *pcVar8;
        break;
      case 3:
        cVar11 = *(xchar *)((long)plVar2->monsters + (long)cVar3 * 0xd8 + 0x3359);
      }
    }
    bVar4 = linedup(u.ux,u.uy,cVar11,cVar10);
    if (bVar4 == '\0') {
      return;
    }
  }
  uVar6 = mt_random();
  pcVar8 = a_gname_at(bx,by);
  if (uVar6 % 3 == 1) {
    pcVar8 = s_suffix(pcVar8);
    line = "%s voice booms:  \"How darest thou harm my servant!\"";
  }
  else if (uVar6 % 3 == 0) {
    line = "%s roars in anger:  \"Thou shalt suffer!\"";
  }
  else {
    line = "%s roars:  \"Thou dost profane my shrine!\"";
  }
  pline(line,pcVar8);
  iVar7 = sgn((int)tbx);
  dy = sgn((int)tby);
  buzz(-0xf,6,cVar11,cVar10,iVar7,dy);
  exercise(2,'\0');
  return;
}

Assistant:

void ghod_hitsu(struct monst *priest)
{
	int x, y, ax, ay, roomno = (int)temple_occupied(u.urooms);
	struct mkroom *troom;

	if (!roomno || !has_shrine(priest))
		return;

	ax = x = EPRI(priest)->shrpos.x;
	ay = y = EPRI(priest)->shrpos.y;
	troom = &level->rooms[roomno - ROOMOFFSET];

	if ((u.ux == x && u.uy == y) || !linedup(u.ux, u.uy, x, y)) {
	    if (IS_DOOR(level->locations[u.ux][u.uy].typ)) {

		if (u.ux == troom->lx - 1) {
		    x = troom->hx;
		    y = u.uy;
		} else if (u.ux == troom->hx + 1) {
		    x = troom->lx;
		    y = u.uy;
		} else if (u.uy == troom->ly - 1) {
		    x = u.ux;
		    y = troom->hy;
		} else if (u.uy == troom->hy + 1) {
		    x = u.ux;
		    y = troom->ly;
		}
	    } else {
		switch(rn2(4)) {
		case 0:  x = u.ux; y = troom->ly; break;
		case 1:  x = u.ux; y = troom->hy; break;
		case 2:  x = troom->lx; y = u.uy; break;
		default: x = troom->hx; y = u.uy; break;
		}
	    }
	    if (!linedup(u.ux, u.uy, x, y)) return;
	}

	switch(rn2(3)) {
	case 0:
	    pline("%s roars in anger:  \"Thou shalt suffer!\"",
			a_gname_at(ax, ay));
	    break;
	case 1:
	    pline("%s voice booms:  \"How darest thou harm my servant!\"",
			s_suffix(a_gname_at(ax, ay)));
	    break;
	default:
	    pline("%s roars:  \"Thou dost profane my shrine!\"",
			a_gname_at(ax, ay));
	    break;
	}

	buzz(-10-(AD_ELEC-1), 6, x, y, sgn(tbx), sgn(tby)); /* bolt of lightning */
	exercise(A_WIS, FALSE);
}